

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

void add_attribute(element_t *element,plutosvg_document_t *document,int id,char *data,size_t length)

{
  attribute *paVar1;
  
  paVar1 = (attribute *)heap_alloc(document->heap,0x20);
  paVar1->id = id;
  (paVar1->value).data = data;
  (paVar1->value).length = length;
  paVar1->next = element->attributes;
  element->attributes = paVar1;
  return;
}

Assistant:

static void add_attribute(element_t* element, plutosvg_document_t* document, int id, const char* data, size_t length)
{
    attribute_t* attribute = heap_alloc(document->heap, sizeof(attribute_t));
    attribute->id = id;
    attribute->value.data = data;
    attribute->value.length = length;
    attribute->next = element->attributes;
    element->attributes = attribute;
}